

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O0

bool __thiscall BamTools::Internal::BamReaderPrivate::Close(BamReaderPrivate *this)

{
  bool bVar1;
  string message;
  string streamError;
  BamException *e;
  BamRandomAccessController *in_stack_ffffffffffffff20;
  BgzfStream *in_stack_ffffffffffffff30;
  
  std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::clear
            ((vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *)0x1ade75);
  BamHeader::Clear((BamHeader *)0x1ade83);
  std::__cxx11::string::clear();
  BamRandomAccessController::Close(in_stack_ffffffffffffff20);
  bVar1 = IsOpen((BamReaderPrivate *)0x1adeac);
  if (bVar1) {
    BgzfStream::Close(in_stack_ffffffffffffff30);
  }
  return true;
}

Assistant:

bool BamReaderPrivate::Close(void) {

    // clear BAM metadata
    m_references.clear();
    m_header.Clear();

    // clear filename
    m_filename.clear();

    // close random access controller
    m_randomAccessController.Close();

    // if stream is open, attempt close
    if ( IsOpen() ) {
        try {
            m_stream.Close();
        } catch ( BamException& e ) {
            const string streamError = e.what();
            const string message = string("encountered error closing BAM file: \n\t") + streamError;
            SetErrorString("BamReader::Close", message);
            return false;
        }
    }

    // return success
    return true;
}